

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar16 [64];
  
  if (0 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount) {
    lVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
    lVar11 = 0;
    iVar13 = 0;
    do {
      iVar9 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      auVar15 = ZEXT816(0) << 0x40;
      auVar16 = ZEXT864(0) << 0x40;
      if (0 < iVar9) {
        iVar10 = iVar9;
        iVar12 = iVar13;
        do {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = destP[iVar12];
          auVar15 = vmaxsd_avx(auVar15,auVar16._0_16_);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = destP[(long)iVar12 + 1];
          auVar15 = vmaxsd_avx(auVar18,auVar15);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = destP[(long)iVar12 + 2];
          auVar15 = vmaxsd_avx(auVar19,auVar15);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = destP[(long)iVar12 + 3];
          auVar15 = vmaxsd_avx(auVar20,auVar15);
          auVar16 = ZEXT1664(auVar15);
          iVar12 = iVar12 + (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      uVar4 = vcmpsd_avx512f(auVar15,ZEXT816(0),0);
      bVar5 = (bool)((byte)uVar4 & 1);
      dVar14 = (double)((ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * auVar15._0_8_);
      if (0 < iVar9) {
        dVar17 = 1.0 / dVar14;
        iVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
        iVar12 = iVar13;
        do {
          pdVar1 = destP + iVar12;
          dVar6 = pdVar1[1];
          dVar7 = pdVar1[2];
          dVar8 = pdVar1[3];
          pdVar2 = destP + iVar12;
          *pdVar2 = dVar17 * *pdVar1;
          pdVar2[1] = dVar17 * dVar6;
          pdVar2[2] = dVar17 * dVar7;
          pdVar2[3] = dVar17 * dVar8;
          iVar12 = iVar12 + iVar10 * 4;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      if (((uint)lVar3 >> 10 & 1) == 0) {
        scaleFactors[lVar11] = dVar14;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar14 = log(dVar14);
LAB_00128f8a:
          cumulativeScaleFactors[lVar11] = dVar14 + cumulativeScaleFactors[lVar11];
        }
      }
      else {
        dVar14 = log(dVar14);
        scaleFactors[lVar11] = dVar14;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_00128f8a;
      }
      lVar11 = lVar11 + 1;
      iVar13 = iVar13 + 4;
    } while (lVar11 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}